

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
VulkanHppGenerator::generateEnumSuffixes
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,VulkanHppGenerator *this,string *name,bool bitmask)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  __sv_type local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  __sv_type local_1b8;
  reference local_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::TagData>
  *tag_1;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::TagData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::TagData>_>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator<char> local_e1;
  string local_e0;
  undefined1 local_c0 [8];
  string tag;
  string shortenedName;
  size_t pos;
  undefined1 local_68 [8];
  string postfix;
  string prefix;
  bool bitmask_local;
  string *name_local;
  VulkanHppGenerator *this_local;
  
  std::__cxx11::string::string((string *)(postfix.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_68);
  bVar1 = std::operator==(name,"VkResult");
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&postfix.field_2 + 8),"VK_");
  }
  else {
    if (bitmask) {
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (name,"FlagBits",0);
      if (sVar2 == 0xffffffffffffffff) {
        __assert_fail("pos != std::string::npos",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x1d1a,
                      "std::pair<std::string, std::string> VulkanHppGenerator::generateEnumSuffixes(const std::string &, bool) const"
                     );
      }
      std::__cxx11::string::string((string *)(tag.field_2._M_local_buf + 8),name);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tag.field_2 + 8),sVar2,8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"",&local_e1);
      findTag((string *)local_c0,this,(string *)((long)&tag.field_2 + 8),&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator(&local_e1);
      stripPostfix(&local_148,(string *)((long)&tag.field_2 + 8),(string *)local_c0);
      toUpperCase(&local_128,&local_148);
      std::operator+(&local_108,&local_128,"_");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&postfix.field_2 + 8),&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)local_c0);
      std::__cxx11::string::~string((string *)(tag.field_2._M_local_buf + 8));
    }
    else {
      toUpperCase((string *)&__range2,name);
      std::operator+(&local_168,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                     "_");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&postfix.field_2 + 8),&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&__range2);
    }
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::TagData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::TagData>_>_>
             ::begin(&this->m_tags);
    tag_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::TagData>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::TagData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::TagData>_>_>
               ::end(&this->m_tags);
    while (bVar1 = std::operator==(&__end2,(_Self *)&tag_1), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_1a8 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::TagData>_>
                  ::operator*(&__end2);
      std::operator+(&local_1d8,&local_1a8->first,"_");
      local_1b8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1d8);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              ends_with((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&postfix.field_2 + 8),local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      if (bVar1) {
        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&postfix.field_2 + 8);
        sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                length(this_00);
        sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                length(&local_1a8->first);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (this_00,~sVar3 + sVar2,0xffffffffffffffff);
        std::operator+(&local_1f8,"_",&local_1a8->first);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   &local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        break;
      }
      local_208 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1a8);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              ends_with(name,local_208);
      if (bVar1) {
        std::operator+(&local_228,"_",&local_1a8->first);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   &local_228);
        std::__cxx11::string::~string((string *)&local_228);
        break;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::TagData>_>
      ::operator++(&__end2);
    }
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&postfix.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(postfix.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> VulkanHppGenerator::generateEnumSuffixes( std::string const & name, bool bitmask ) const
{
  std::string prefix, postfix;
  if ( name == "VkResult" )
  {
    prefix = "VK_";
  }
  else
  {
    if ( bitmask )
    {
      // for a bitmask enum, start with "VK", cut off the trailing "FlagBits", and convert that name to upper case
      // end that with "Bit"
      const size_t pos = name.find( "FlagBits" );
      assert( pos != std::string::npos );
      std::string shortenedName = name;
      shortenedName.erase( pos, strlen( "FlagBits" ) );
      std::string tag = findTag( shortenedName );
      prefix          = toUpperCase( stripPostfix( shortenedName, tag ) ) + "_";
    }
    else
    {
      // for a non-bitmask enum, convert the name to upper case
      prefix = toUpperCase( name ) + "_";
    }

    // if the enum name contains a tag move it from the prefix to the postfix to generate correct enum value
    // names.
    for ( auto const & tag : m_tags )
    {
      if ( prefix.ends_with( tag.first + "_" ) )
      {
        prefix.erase( prefix.length() - tag.first.length() - 1 );
        postfix = "_" + tag.first;
        break;
      }
      else if ( name.ends_with( tag.first ) )
      {
        postfix = "_" + tag.first;
        break;
      }
    }
  }

  return { prefix, postfix };
}